

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *args)

{
  undefined2 uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  U64 UVar7;
  long *in_RDI;
  int nbBytes;
  int nbBits;
  int ctz;
  int entry;
  int index;
  size_t symbols;
  size_t iters;
  size_t iiters;
  size_t oiters;
  int symbol;
  int stream;
  BYTE *olimit;
  BYTE *ilimit;
  BYTE *oend;
  U16 *dtable;
  BYTE *op [4];
  BYTE *ip [4];
  U64 bits [4];
  ulong local_e0;
  ulong local_d8;
  int local_90;
  int local_8c;
  ulong local_68 [8];
  U64 local_28 [4];
  long *local_8;
  
  lVar2 = in_RDI[0xc];
  uVar3 = in_RDI[0xe];
  uVar4 = in_RDI[0xd];
  local_28[0] = in_RDI[8];
  local_28[1] = in_RDI[9];
  local_28[2] = in_RDI[10];
  local_28[3] = in_RDI[0xb];
  local_68[4] = *in_RDI;
  local_68[5] = in_RDI[1];
  local_68[6] = in_RDI[2];
  local_68[7] = in_RDI[3];
  local_68[0] = in_RDI[4];
  local_68[1] = in_RDI[5];
  local_68[2] = in_RDI[6];
  local_68[3] = in_RDI[7];
  local_8 = in_RDI;
  uVar5 = MEM_isLittleEndian();
  if (uVar5 == 0) {
    __assert_fail("MEM_isLittleEndian()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8ef4,
                  "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                 );
  }
  uVar5 = MEM_32bits();
  if (uVar5 != 0) {
    __assert_fail("!MEM_32bits()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8ef5,
                  "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                 );
  }
  while( true ) {
    for (local_8c = 0; local_8c < 4; local_8c = local_8c + 1) {
      local_d8 = uVar3;
      if (local_8c != 3) {
        local_d8 = local_68[local_8c + 1];
      }
      if (local_d8 < local_68[local_8c]) {
        __assert_fail("op[stream] <= (stream == 3 ? oend : op[stream + 1])",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8eff,
                      "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                     );
      }
      if (local_68[(long)local_8c + 4] < uVar4) {
        __assert_fail("ip[stream] >= ilimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8f00,
                      "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                     );
      }
    }
    uVar6 = (uVar3 - local_68[3]) / 5;
    local_e0 = (local_68[4] - uVar4) / 7;
    if (uVar6 < local_e0) {
      local_e0 = uVar6;
    }
    uVar6 = local_68[3] + local_e0 * 5;
    if (uVar6 < local_68[3] + 0x14) break;
    for (local_8c = 1; local_8c < 4; local_8c = local_8c + 1) {
      if (local_68[(long)local_8c + 4] < local_68[(long)(local_8c + -1) + 4]) goto LAB_003a981c;
    }
    for (local_8c = 1; local_8c < 4; local_8c = local_8c + 1) {
      if (local_68[(long)local_8c + 4] < local_68[(long)(local_8c + -1) + 4]) {
        __assert_fail("ip[stream] >= ip[stream - 1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8f25,
                      "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                     );
      }
    }
    do {
      for (local_90 = 0; local_90 < 5; local_90 = local_90 + 1) {
        for (local_8c = 0; local_8c < 4; local_8c = local_8c + 1) {
          uVar1 = *(undefined2 *)(lVar2 + (long)(int)(uint)(local_28[local_8c] >> 0x35) * 2);
          local_28[local_8c] = local_28[local_8c] << ((byte)uVar1 & 0x3f);
          *(char *)(local_68[local_8c] + (long)local_90) = (char)((ushort)uVar1 >> 8);
        }
      }
      for (local_8c = 0; local_8c < 4; local_8c = local_8c + 1) {
        uVar5 = ZSTD_countTrailingZeros64(local_28[local_8c]);
        local_68[local_8c] = local_68[local_8c] + 5;
        local_68[(long)local_8c + 4] = local_68[(long)local_8c + 4] - (long)((int)uVar5 >> 3);
        UVar7 = MEM_read64((void *)local_68[(long)local_8c + 4]);
        local_28[local_8c] = UVar7 | 1;
        local_28[local_8c] = local_28[local_8c] << ((byte)uVar5 & 7);
      }
    } while (local_68[3] < uVar6);
  }
LAB_003a981c:
  local_8[8] = local_28[0];
  local_8[9] = local_28[1];
  local_8[10] = local_28[2];
  local_8[0xb] = local_28[3];
  *local_8 = local_68[4];
  local_8[1] = local_68[5];
  local_8[2] = local_68[6];
  local_8[3] = local_68[7];
  local_8[4] = local_68[0];
  local_8[5] = local_68[1];
  local_8[6] = local_68[2];
  local_8[7] = local_68[3];
  return;
}

Assistant:

static HUF_FAST_BMI2_ATTRS
void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs* args)
{
    U64 bits[4];
    BYTE const* ip[4];
    BYTE* op[4];
    U16 const* const dtable = (U16 const*)args->dt;
    BYTE* const oend = args->oend;
    BYTE const* const ilimit = args->ilimit;

    /* Copy the arguments to local variables */
    ZSTD_memcpy(&bits, &args->bits, sizeof(bits));
    ZSTD_memcpy((void*)(&ip), &args->ip, sizeof(ip));
    ZSTD_memcpy(&op, &args->op, sizeof(op));

    assert(MEM_isLittleEndian());
    assert(!MEM_32bits());

    for (;;) {
        BYTE* olimit;
        int stream;
        int symbol;

        /* Assert loop preconditions */
#ifndef NDEBUG
        for (stream = 0; stream < 4; ++stream) {
            assert(op[stream] <= (stream == 3 ? oend : op[stream + 1]));
            assert(ip[stream] >= ilimit);
        }
#endif
        /* Compute olimit */
        {
            /* Each iteration produces 5 output symbols per stream */
            size_t const oiters = (size_t)(oend - op[3]) / 5;
            /* Each iteration consumes up to 11 bits * 5 = 55 bits < 7 bytes
             * per stream.
             */
            size_t const iiters = (size_t)(ip[0] - ilimit) / 7;
            /* We can safely run iters iterations before running bounds checks */
            size_t const iters = MIN(oiters, iiters);
            size_t const symbols = iters * 5;

            /* We can simply check that op[3] < olimit, instead of checking all
             * of our bounds, since we can't hit the other bounds until we've run
             * iters iterations, which only happens when op[3] == olimit.
             */
            olimit = op[3] + symbols;

            /* Exit fast decoding loop once we get close to the end. */
            if (op[3] + 20 > olimit)
                break;

            /* Exit the decoding loop if any input pointer has crossed the
             * previous one. This indicates corruption, and a precondition
             * to our loop is that ip[i] >= ip[0].
             */
            for (stream = 1; stream < 4; ++stream) {
                if (ip[stream] < ip[stream - 1])
                    goto _out;
            }
        }

#ifndef NDEBUG
        for (stream = 1; stream < 4; ++stream) {
            assert(ip[stream] >= ip[stream - 1]);
        }
#endif

        do {
            /* Decode 5 symbols in each of the 4 streams */
            for (symbol = 0; symbol < 5; ++symbol) {
                for (stream = 0; stream < 4; ++stream) {
                    int const index = (int)(bits[stream] >> 53);
                    int const entry = (int)dtable[index];
                    bits[stream] <<= (entry & 63);
                    op[stream][symbol] = (BYTE)((entry >> 8) & 0xFF);
                }
            }
            /* Reload the bitstreams */
            for (stream = 0; stream < 4; ++stream) {
                int const ctz = ZSTD_countTrailingZeros64(bits[stream]);
                int const nbBits = ctz & 7;
                int const nbBytes = ctz >> 3;
                op[stream] += 5;
                ip[stream] -= nbBytes;
                bits[stream] = MEM_read64(ip[stream]) | 1;
                bits[stream] <<= nbBits;
            }
        } while (op[3] < olimit);
    }

_out:

    /* Save the final values of each of the state variables back to args. */
    ZSTD_memcpy(&args->bits, &bits, sizeof(bits));
    ZSTD_memcpy((void*)(&args->ip), &ip, sizeof(ip));
    ZSTD_memcpy(&args->op, &op, sizeof(op));
}